

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

TransposeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_transpose(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x3d9) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3d9;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    TransposeLayerParams::TransposeLayerParams(this_00.transpose_);
    (this->layer_).transpose_ = (TransposeLayerParams *)this_00;
  }
  return (TransposeLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::TransposeLayerParams* NeuralNetworkLayer::mutable_transpose() {
  if (!has_transpose()) {
    clear_layer();
    set_has_transpose();
    layer_.transpose_ = new ::CoreML::Specification::TransposeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.transpose)
  return layer_.transpose_;
}